

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

ssize_t __thiscall
Liby::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ssize_t extraout_RAX;
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  io_task task;
  BasicHandler *handler_local;
  Buffer *buf_local;
  Connection *this_local;
  
  task.handler_._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
        )(__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
          )__buf;
  io_task::io_task((io_task *)(local_68 + 0x10));
  std::make_shared<Liby::Buffer,Liby::Buffer>((Buffer *)local_68);
  std::shared_ptr<Liby::Buffer>::operator=
            ((shared_ptr<Liby::Buffer> *)&task.len_,(shared_ptr<Liby::Buffer> *)local_68);
  std::shared_ptr<Liby::Buffer>::~shared_ptr((shared_ptr<Liby::Buffer> *)local_68);
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)
                     task.handler_._M_t.
                     super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                     .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl);
  if (bVar1) {
    std::make_unique<std::function<void()>,std::function<void()>const&>
              ((function<void_()> *)local_80);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    operator=((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
              &task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ,(unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
               local_80);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *
                )local_80);
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)(local_68 + 0x10));
  enableWrit(this,true);
  io_task::~io_task((io_task *)(local_68 + 0x10));
  return extraout_RAX;
}

Assistant:

void Connection::send(Buffer &&buf, const BasicHandler &handler) {
    io_task task;
    task.buffer_ = std::make_shared<Buffer>(std::move(buf));
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}